

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<LookupIdentifier&>
          (RangeSelectExpression *this,LookupIdentifier *visitor)

{
  Expression::visit<LookupIdentifier&>(this->value_,visitor);
  Expression::visit<LookupIdentifier&>(this->left_,visitor);
  Expression::visit<LookupIdentifier&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }